

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

char * __thiscall regexsearcher::search(regexsearcher *this,char *first,char *last,CallbackType *cb)

{
  bool bVar1;
  type this_00;
  const_reference pvVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> b;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> a;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  local_58;
  shared_ptr<boost::regex_iterator_implementation<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
  local_40;
  
  boost::
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
  regex_iterator((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                  *)&local_40,first,last,&this->re,match_partial);
  local_58.pdata.px = (element_type *)0x0;
  local_58.pdata.pn.pi_ = (sp_counted_base *)0x0;
  pcVar5 = (char *)0x0;
  pcVar4 = (char *)0x0;
  do {
    bVar1 = boost::
            regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
            ::operator!=((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)&local_40,&local_58);
    if (!bVar1) {
      pcVar6 = pcVar5;
      if (pcVar5 < pcVar4) {
        pcVar6 = last;
      }
      if (pcVar4 == (char *)0x0 && pcVar5 == (char *)0x0) {
        pcVar6 = last;
      }
LAB_0010f991:
      boost::detail::shared_count::~shared_count(&local_58.pdata.pn);
      boost::detail::shared_count::~shared_count(&local_40.pn);
      return pcVar6;
    }
    this_00 = boost::
              shared_ptr<boost::regex_iterator_implementation<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
              ::operator->(&local_40);
    pvVar2 = boost::match_results<const_char_*,_std::allocator<boost::sub_match<const_char_*>_>_>::
             operator[](&this_00->what,0);
    pcVar6 = (pvVar2->super_pair<const_char_*,_const_char_*>).first;
    if (pvVar2->matched == true) {
      bVar1 = std::function<bool_(const_char_*,_const_char_*)>::operator()
                        (cb,pcVar6,(pvVar2->super_pair<const_char_*,_const_char_*>).second);
      if (!bVar1) {
        pcVar6 = (char *)0x0;
        goto LAB_0010f991;
      }
      pcVar3 = pcVar4;
      if (pcVar4 < pcVar6) {
        pcVar3 = pcVar6;
      }
      bVar1 = pcVar4 == (char *)0x0;
      pcVar4 = pcVar3;
      if (bVar1) {
        pcVar4 = pcVar6;
      }
    }
    else {
      pcVar3 = pcVar5;
      if (pcVar5 < pcVar6) {
        pcVar3 = pcVar6;
      }
      bVar1 = pcVar5 == (char *)0x0;
      pcVar5 = pcVar3;
      if (bVar1) {
        pcVar5 = pcVar6;
      }
    }
    boost::
    regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    operator++((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                *)&local_40);
  } while( true );
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        REGEX_ITER<const char*> a(first, last, re   PARTIALARG);
        REGEX_ITER<const char*> b;

        const char *maxpartial = NULL;
        const char *maxmatch = NULL;

        //printf("searchrange(%p, %p)\n", first, last);
        while (a != b) {
            auto m = (*a)[0];
            //printf("    match %d  %p..%p\n", m.matched, m.first, m.second);
            if (m.matched) {
                if (!cb(m.first, m.second)) {
                    //printf("searchrange: stopping\n");
                    return NULL;
                }
                if (maxmatch == NULL || maxmatch < m.first)
                    maxmatch = m.first;
            }
            else {
                if (maxpartial == NULL || maxpartial < m.first)
                    maxpartial = m.first;
            }

            ++a;
        }
        if ((maxmatch == NULL && maxpartial == NULL) || maxmatch > maxpartial) {
            //printf("searchrange: no partial match\n");
            return last;
        }

        //printf("searchrange: partial match @%lx\n", maxpartial-first);
        return maxpartial;
    }